

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O1

Result __thiscall
wabt::BinaryReaderLogging::BeginGlobal
          (BinaryReaderLogging *this,Index index,Type type,bool mutable_)

{
  Enum EVar1;
  char *pcVar2;
  char *pcVar3;
  
  WriteIndent(this);
  if (type < Anyfunc) {
    if (type == Void) {
      pcVar2 = "void";
      goto LAB_00f4f747;
    }
    if (type == Func) {
      pcVar2 = "func";
      goto LAB_00f4f747;
    }
    if (type == ExceptRef) {
      pcVar2 = "except_ref";
      goto LAB_00f4f747;
    }
switchD_00f4f6d5_caseD_fffffff1:
    pcVar2 = "<type index>";
  }
  else {
    switch(type) {
    case Any:
      pcVar2 = "any";
      break;
    case Anyfunc:
      pcVar2 = "anyfunc";
      break;
    default:
      goto switchD_00f4f6d5_caseD_fffffff1;
    case V128:
      pcVar2 = "v128";
      break;
    case F64:
      pcVar2 = "f64";
      break;
    case F32:
      pcVar2 = "f32";
      break;
    case I64:
      pcVar2 = "i64";
      break;
    case I32:
      pcVar2 = "i32";
    }
  }
LAB_00f4f747:
  pcVar3 = "false";
  if (mutable_) {
    pcVar3 = "true";
  }
  Stream::Writef(this->stream_,"BeginGlobal(index: %u, type: %s, mutable: %s)\n",(ulong)index,pcVar2
                 ,pcVar3);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x24])
                    (this->reader_,(ulong)index,(ulong)(uint)type,(ulong)mutable_);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::BeginGlobal(Index index, Type type, bool mutable_) {
  LOGF("BeginGlobal(index: %" PRIindex ", type: %s, mutable: %s)\n", index,
       GetTypeName(type), mutable_ ? "true" : "false");
  return reader_->BeginGlobal(index, type, mutable_);
}